

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ConstExpr.cpp
# Opt level: O0

void TestConstExpr::ComparisonTestTU<unsigned_int,unsigned_char>(void)

{
  int iVar1;
  
  if (ComparisonTestTU<unsigned_int,unsigned_char>()::b1 == '\0') {
    iVar1 = __cxa_guard_acquire(&ComparisonTestTU<unsigned_int,unsigned_char>()::b1);
    if (iVar1 != 0) {
      ComparisonTestTU<unsigned_int,_unsigned_char>::b1 = LessThanTest<unsigned_int,unsigned_char>()
      ;
      __cxa_guard_release(&ComparisonTestTU<unsigned_int,unsigned_char>()::b1);
    }
  }
  if (ComparisonTestTU<unsigned_int,unsigned_char>()::b2 == '\0') {
    iVar1 = __cxa_guard_acquire(&ComparisonTestTU<unsigned_int,unsigned_char>()::b2);
    if (iVar1 != 0) {
      ComparisonTestTU<unsigned_int,_unsigned_char>::b2 =
           LessThanEqualTest<unsigned_int,unsigned_char>();
      __cxa_guard_release(&ComparisonTestTU<unsigned_int,unsigned_char>()::b2);
    }
  }
  if (ComparisonTestTU<unsigned_int,unsigned_char>()::b3 == '\0') {
    iVar1 = __cxa_guard_acquire(&ComparisonTestTU<unsigned_int,unsigned_char>()::b3);
    if (iVar1 != 0) {
      ComparisonTestTU<unsigned_int,_unsigned_char>::b3 =
           GreaterThanTest<unsigned_int,unsigned_char>();
      __cxa_guard_release(&ComparisonTestTU<unsigned_int,unsigned_char>()::b3);
    }
  }
  if (ComparisonTestTU<unsigned_int,unsigned_char>()::b4 == '\0') {
    iVar1 = __cxa_guard_acquire(&ComparisonTestTU<unsigned_int,unsigned_char>()::b4);
    if (iVar1 != 0) {
      ComparisonTestTU<unsigned_int,_unsigned_char>::b4 =
           GreaterThanEqualTest<unsigned_int,unsigned_char>();
      __cxa_guard_release(&ComparisonTestTU<unsigned_int,unsigned_char>()::b4);
    }
  }
  if (ComparisonTestTU<unsigned_int,unsigned_char>()::b5 == '\0') {
    iVar1 = __cxa_guard_acquire(&ComparisonTestTU<unsigned_int,unsigned_char>()::b5);
    if (iVar1 != 0) {
      ComparisonTestTU<unsigned_int,_unsigned_char>::b5 = EqualTest<unsigned_int,unsigned_char>();
      __cxa_guard_release(&ComparisonTestTU<unsigned_int,unsigned_char>()::b5);
    }
  }
  if (ComparisonTestTU<unsigned_int,unsigned_char>()::b6 == '\0') {
    iVar1 = __cxa_guard_acquire(&ComparisonTestTU<unsigned_int,unsigned_char>()::b6);
    if (iVar1 != 0) {
      ComparisonTestTU<unsigned_int,_unsigned_char>::b6 = NotEqualTest<unsigned_int,unsigned_char>()
      ;
      __cxa_guard_release(&ComparisonTestTU<unsigned_int,unsigned_char>()::b6);
    }
  }
  return;
}

Assistant:

void ComparisonTestTU()
	{
		static bool b1 = LessThanTest<T, U>();
		static bool b2 = LessThanEqualTest<T, U>();
		static bool b3 = GreaterThanTest<T, U>();
		static bool b4 = GreaterThanEqualTest<T, U>();
		static bool b5 = EqualTest<T, U>();
		static bool b6 = NotEqualTest<T, U>();
	}